

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseOpenRangeElement
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  ExpressionSyntax *right;
  OpenRangeExpressionSyntax *pOVar3;
  Token openBracket;
  Token colon;
  Token closeBracket;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (bVar1) {
    openBracket = ParserBase::consume(&this->super_ParserBase);
    pEVar2 = parseExpression(this);
    colon = ParserBase::expect(&this->super_ParserBase,Colon);
    right = parseExpression(this);
    closeBracket = ParserBase::expect(&this->super_ParserBase,CloseBracket);
    pOVar3 = slang::syntax::SyntaxFactory::openRangeExpression
                       (&this->factory,openBracket,pEVar2,colon,right,closeBracket);
    return &pOVar3->super_ExpressionSyntax;
  }
  pEVar2 = parseSubExpression(this,options,0);
  return pEVar2;
}

Assistant:

ExpressionSyntax& Parser::parseOpenRangeElement(bitmask<ExpressionOptions> options) {
    if (!peek(TokenKind::OpenBracket))
        return parseSubExpression(options, 0);

    auto openBracket = consume();
    auto& left = parseExpression();
    auto colon = expect(TokenKind::Colon);
    auto& right = parseExpression();
    auto closeBracket = expect(TokenKind::CloseBracket);
    return factory.openRangeExpression(openBracket, left, colon, right, closeBracket);
}